

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

VOID FreeLibraryAndExitThread(HMODULE hLibModule,DWORD dwExitCode)

{
  if (PAL_InitializeChakraCoreCalled) {
    FreeLibrary(hLibModule);
    ExitThread(dwExitCode);
  }
  abort();
}

Assistant:

PALIMPORT
VOID
PALAPI
FreeLibraryAndExitThread(
    IN HMODULE hLibModule,
    IN DWORD dwExitCode)
{
    PERF_ENTRY(FreeLibraryAndExitThread);
    ENTRY("FreeLibraryAndExitThread()\n");
    FreeLibrary(hLibModule);
    ExitThread(dwExitCode);
    LOGEXIT("FreeLibraryAndExitThread\n");
    PERF_EXIT(FreeLibraryAndExitThread);
}